

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-tval.c
# Opt level: O0

char * de_armour(char *name)

{
  char *pcVar1;
  char *armour;
  char newname [40];
  char *name_local;
  
  newname._32_8_ = name;
  my_strcpy((char *)&armour,name,0x28);
  pcVar1 = strstr((char *)&armour,"armour");
  if (pcVar1 != (char *)0x0) {
    my_strcpy(pcVar1 + 4,"r",2);
  }
  pcVar1 = string_make((char *)&armour);
  return pcVar1;
}

Assistant:

static char *de_armour(const char *name)
{
	char newname[40];
	char *armour;

	my_strcpy(newname, name, sizeof(newname));
	armour = strstr(newname, "armour");
	if (armour)
		my_strcpy(armour + 4, "r", 2);

	return string_make(newname);
}